

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O3

void xm_handle_note_and_instrument(xm_context_t *ctx,xm_channel_context_t *ch,xm_pattern_slot_t *s)

{
  xm_frequency_type_t xVar1;
  xm_instrument_t *pxVar2;
  xm_sample_t *pxVar3;
  uint8_t uVar4;
  byte bVar5;
  xm_waveform_type_t xVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  
  bVar7 = s->instrument;
  if (bVar7 != 0) {
    uVar4 = ch->current->effect_type;
    if ((((uVar4 == '\x03') || (uVar4 == '\x05')) || (0xef < ch->current->volume_column)) &&
       ((ch->instrument != (xm_instrument_t *)0x0 && (ch->sample != (xm_sample_t *)0x0)))) {
      uVar8 = 6;
    }
    else {
      if ((s->note != '\0') || (ch->sample == (xm_sample_t *)0x0)) {
        if ((ctx->module).num_instruments < (ushort)bVar7) {
          ch->volume = 0.0;
          ch->instrument = (xm_instrument_t *)0x0;
          ch->sample = (xm_sample_t *)0x0;
        }
        else {
          ch->instrument = (ctx->module).instruments + ((ulong)(ushort)bVar7 - 1);
        }
        goto LAB_001074be;
      }
      uVar8 = 4;
    }
    xm_trigger_note(ctx,ch,uVar8);
  }
LAB_001074be:
  bVar7 = s->note;
  if ((byte)(bVar7 - 1) < 0x60) {
    pxVar2 = ch->instrument;
    uVar4 = ch->current->effect_type;
    if ((uVar4 == '\x03') || (uVar4 == '\x05')) {
      if (pxVar2 != (xm_instrument_t *)0x0) goto LAB_00107527;
    }
    else {
      if (ch->current->volume_column < 0xf0 || pxVar2 == (xm_instrument_t *)0x0) {
        if (pxVar2 == (xm_instrument_t *)0x0) goto LAB_0010763b;
      }
      else {
LAB_00107527:
        pxVar3 = ch->sample;
        if (pxVar3 != (xm_sample_t *)0x0) {
          fVar10 = (float)(int)pxVar3->finetune * 0.0078125 +
                   (float)(int)((int)pxVar3->relative_note + (uint)bVar7) + -1.0;
          ch->note = fVar10;
          xVar1 = (ctx->module).frequency_type;
          if (xVar1 == XM_AMIGA_FREQUENCIES) {
            fVar11 = xm_amiga_period(fVar10);
          }
          else {
            fVar11 = 0.0;
            if (xVar1 == XM_LINEAR_FREQUENCIES) {
              fVar11 = fVar10 * -64.0 + 7680.0;
            }
          }
          ch->tone_portamento_target_period = fVar11;
          goto LAB_00107663;
        }
      }
      if ((pxVar2->num_samples != 0) &&
         ((ushort)pxVar2->sample_of_notes[(ulong)bVar7 - 1] < pxVar2->num_samples)) {
        lVar9 = 0x2c;
        do {
          fVar10 = xm_next_of_sample(ch);
          (&ch->note)[lVar9] = fVar10;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x4c);
        ch->frame_count = 0;
        pxVar3 = pxVar2->samples;
        bVar7 = s->note;
        bVar5 = pxVar2->sample_of_notes[(ulong)bVar7 - 1];
        ch->sample = pxVar3 + bVar5;
        fVar10 = (float)(int)pxVar3[bVar5].finetune * 0.0078125 +
                 (float)(int)((int)pxVar3[bVar5].relative_note + (uint)bVar7) + -1.0;
        ch->note = fVar10;
        ch->orig_note = fVar10;
        xm_trigger_note(ctx,ch,(uint)(s->instrument == '\0'));
        goto LAB_00107663;
      }
    }
LAB_0010763b:
    ch->volume = 0.0;
  }
  else if (bVar7 == 0x61) {
    ch->sustained = false;
    if ((ch->instrument == (xm_instrument_t *)0x0) ||
       ((ch->instrument->volume_envelope).enabled == false)) goto LAB_0010763b;
  }
LAB_00107663:
  bVar7 = s->volume_column;
  switch(bVar7 >> 4) {
  case 1:
  case 2:
  case 3:
  case 4:
switchD_00107686_caseD_1:
    ch->volume = (float)(int)(bVar7 - 0x10) * 0.015625;
    break;
  case 5:
    if (bVar7 < 0x51) goto switchD_00107686_caseD_1;
    break;
  case 8:
    bVar7 = bVar7 & 0xf;
    goto LAB_001076fa;
  case 9:
    bVar7 = bVar7 << 4;
LAB_001076fa:
    xm_volume_slide(ch,bVar7);
    break;
  case 10:
    ch->vibrato_param = bVar7 << 4 | ch->vibrato_param & 0xf;
    break;
  case 0xc:
    uVar8 = bVar7 & 0xf;
    ch->panning = (float)(uVar8 << 4 | uVar8) / 255.0;
    break;
  case 0xf:
    if ((bVar7 & 0xf) != 0) {
      ch->tone_portamento_param = bVar7 << 4 | bVar7 & 0xf;
    }
  }
  switch(s->effect_type) {
  case '\x01':
    if (s->effect_param != '\0') {
      ch->portamento_up_param = s->effect_param;
    }
    break;
  case '\x02':
    if (s->effect_param != '\0') {
      ch->portamento_down_param = s->effect_param;
    }
    break;
  case '\x03':
    if (s->effect_param != '\0') {
      ch->tone_portamento_param = s->effect_param;
    }
    break;
  case '\x04':
    bVar7 = s->effect_param;
    if ((bVar7 & 0xf) != 0) {
      ch->vibrato_param = ch->vibrato_param & 0xf0 | bVar7 & 0xf;
    }
    if (0xf < bVar7) {
      ch->vibrato_param = ch->vibrato_param & 0xf | bVar7 & 0xf0;
    }
    break;
  case '\x05':
  case '\x06':
  case '\n':
    if (s->effect_param != '\0') {
      ch->volume_slide_param = s->effect_param;
    }
    break;
  case '\a':
    bVar7 = s->effect_param;
    if ((bVar7 & 0xf) != 0) {
      ch->tremolo_param = ch->tremolo_param & 0xf0 | bVar7 & 0xf;
    }
    if (0xf < bVar7) {
      ch->tremolo_param = ch->tremolo_param & 0xf | bVar7 & 0xf0;
    }
    break;
  case '\b':
    ch->panning = (float)s->effect_param / 255.0;
    break;
  case '\t':
    pxVar3 = ch->sample;
    if ((pxVar3 != (xm_sample_t *)0x0) && ((byte)(s->note - 1) < 0x60)) {
      uVar8 = (uint)s->effect_param << (8U - (pxVar3->bits == '\x10') & 0x1f);
      if (uVar8 < pxVar3->length) {
        ch->sample_position = (float)(int)uVar8;
      }
      else {
        ch->sample_position = -1.0;
      }
    }
    break;
  case '\v':
    bVar7 = s->effect_param;
    if ((ushort)bVar7 < (ctx->module).length) {
      ctx->position_jump = true;
      ctx->jump_dest = bVar7;
      ctx->jump_row = '\0';
    }
    break;
  case '\f':
    if (s->effect_param < 0x41) {
      fVar10 = (float)s->effect_param * 0.015625;
    }
    else {
      fVar10 = 1.0;
    }
    ch->volume = fVar10;
    break;
  case '\r':
    ctx->pattern_break = true;
    uVar4 = (s->effect_param & 0xf) + (s->effect_param >> 4) * '\n';
LAB_001077f6:
    ctx->jump_row = uVar4;
    break;
  case '\x0e':
    bVar7 = s->effect_param;
    if (0xd < (bVar7 >> 4) - 1) {
      return;
    }
    xVar6 = (xm_waveform_type_t)bVar7;
    switch((uint)(bVar7 >> 4)) {
    case 1:
      xVar6 = xVar6 & 0xf;
      if ((bVar7 & 0xf) == 0) {
        xVar6 = (xm_waveform_type_t)ch->fine_portamento_up_param;
      }
      else {
        ch->fine_portamento_up_param = (uint8_t)xVar6;
      }
      xVar6 = -xVar6;
      goto LAB_00107bd3;
    case 2:
      xVar6 = xVar6 & 0xf;
      if ((bVar7 & 0xf) == 0) {
        xVar6 = (xm_waveform_type_t)ch->fine_portamento_down_param;
      }
      else {
        ch->fine_portamento_down_param = (uint8_t)xVar6;
      }
LAB_00107bd3:
      fVar10 = (float)(int)xVar6;
      if ((ctx->module).frequency_type == XM_LINEAR_FREQUENCIES) {
        fVar10 = fVar10 * 4.0;
      }
      fVar10 = fVar10 + ch->period;
      fVar11 = 0.0;
      if (0.0 <= fVar10) {
        fVar11 = fVar10;
      }
LAB_00107bf5:
      ch->period = fVar11;
LAB_00107bfa:
      xm_update_frequency(ctx,ch);
      return;
    case 4:
      ch->vibrato_waveform = xVar6 & XM_RANDOM_WAVEFORM;
      ch->vibrato_waveform_retrigger = (bVar7 & 4) == 0;
      break;
    case 5:
      bVar5 = ch->current->note;
      if (0x5f < (byte)(bVar5 - 1)) {
        return;
      }
      if (ch->sample == (xm_sample_t *)0x0) {
        return;
      }
      fVar10 = (float)(int)((bVar7 & 0xf) * 0x10 + -0x80) * 0.0078125 +
               (float)(int)((int)ch->sample->relative_note + (uint)bVar5) + -1.0;
      ch->note = fVar10;
      xVar1 = (ctx->module).frequency_type;
      if (xVar1 == XM_AMIGA_FREQUENCIES) {
        fVar11 = xm_amiga_period(fVar10);
      }
      else {
        fVar11 = 0.0;
        if (xVar1 == XM_LINEAR_FREQUENCIES) {
          fVar11 = fVar10 * -64.0 + 7680.0;
        }
      }
      goto LAB_00107bf5;
    case 6:
      if ((bVar7 & 0xf) != 0) {
        if ((xVar6 & 0xf) == (uint)ch->pattern_loop_count) {
          ch->pattern_loop_count = '\0';
          return;
        }
        ch->pattern_loop_count = ch->pattern_loop_count + 1;
        ctx->position_jump = true;
        ctx->jump_row = ch->pattern_loop_origin;
        ctx->jump_dest = ctx->current_table_index;
        return;
      }
      uVar4 = ctx->current_row;
      ch->pattern_loop_origin = uVar4;
      goto LAB_001077f6;
    case 7:
      ch->tremolo_waveform = xVar6 & XM_RANDOM_WAVEFORM;
      ch->tremolo_waveform_retrigger = (bVar7 & 4) == 0;
      break;
    case 10:
      bVar5 = bVar7 & 0xf;
      if ((bVar7 & 0xf) == 0) {
        bVar5 = ch->fine_volume_slide_param;
      }
      else {
        ch->fine_volume_slide_param = bVar5;
      }
      bVar5 = bVar5 << 4;
      goto LAB_00107c19;
    case 0xb:
      bVar5 = bVar7 & 0xf;
      if ((bVar7 & 0xf) == 0) {
        bVar5 = ch->fine_volume_slide_param;
      }
      else {
        ch->fine_volume_slide_param = bVar5;
      }
LAB_00107c19:
      xm_volume_slide(ch,bVar5);
      return;
    case 0xd:
      if ((s->note == '\0') && (s->instrument == '\0')) {
        if ((ch->current->effect_param & 0xf) == 0) {
          uVar8 = 7;
        }
        else {
          ch->note = ch->orig_note;
          uVar8 = 1;
        }
        xm_trigger_note(ctx,ch,uVar8);
        return;
      }
      break;
    case 0xe:
      ctx->extra_ticks = (ch->current->effect_param & 0xf) * ctx->tempo;
    }
    break;
  case '\x0f':
    bVar7 = s->effect_param;
    if (bVar7 != 0) {
      if (bVar7 < 0x20) {
        ctx->tempo = (ushort)bVar7;
      }
      else {
        ctx->bpm = (ushort)bVar7;
      }
    }
    break;
  case '\x10':
    if (s->effect_param < 0x41) {
      fVar10 = (float)s->effect_param * 0.015625;
    }
    else {
      fVar10 = 1.0;
    }
    ctx->global_volume = fVar10;
    break;
  case '\x11':
    if (s->effect_param != '\0') {
      ch->global_volume_slide_param = s->effect_param;
    }
    break;
  case '\x15':
    bVar7 = s->effect_param;
    ch->volume_envelope_frame_count = (ushort)bVar7;
    ch->panning_envelope_frame_count = (ushort)bVar7;
    break;
  case '\x19':
    if (s->effect_param != '\0') {
      ch->panning_slide_param = s->effect_param;
    }
    break;
  case '\x1b':
    bVar7 = s->effect_param;
    if (bVar7 != 0) {
      if (bVar7 < 0x10) {
        ch->multi_retrig_param = ch->multi_retrig_param & 0xf0 | bVar7;
      }
      else {
        ch->multi_retrig_param = bVar7;
      }
    }
    break;
  case '\x1d':
    if (s->effect_param != '\0') {
      ch->tremor_param = s->effect_param;
    }
    break;
  case '!':
    bVar7 = s->effect_param;
    if (bVar7 >> 4 != 2) {
      if (bVar7 >> 4 != 1) {
        return;
      }
      bVar5 = bVar7 & 0xf;
      if ((bVar7 & 0xf) == 0) {
        bVar5 = ch->extra_fine_portamento_up_param;
      }
      else {
        ch->extra_fine_portamento_up_param = bVar5;
      }
      fVar10 = (float)bVar5;
      if ((ctx->module).frequency_type == XM_LINEAR_FREQUENCIES) {
        fVar10 = fVar10 * 4.0;
      }
      fVar10 = ch->period - fVar10;
      fVar11 = 0.0;
      if (0.0 <= fVar10) {
        fVar11 = fVar10;
      }
      ch->period = fVar11;
      goto LAB_00107bfa;
    }
    xVar6 = bVar7 & 0xf;
    if ((bVar7 & 0xf) == 0) {
      xVar6 = (xm_waveform_type_t)ch->extra_fine_portamento_down_param;
    }
    else {
      ch->extra_fine_portamento_down_param = (uint8_t)xVar6;
    }
    goto LAB_00107bd3;
  }
  return;
}

Assistant:

static void xm_handle_note_and_instrument(xm_context_t* ctx, xm_channel_context_t* ch,
										  xm_pattern_slot_t* s) {
	if(s->instrument > 0) {
		if(HAS_TONE_PORTAMENTO(ch->current) && ch->instrument != NULL && ch->sample != NULL) {
			/* Tone portamento in effect, unclear stuff happens */
			xm_trigger_note(ctx, ch, XM_TRIGGER_KEEP_PERIOD | XM_TRIGGER_KEEP_SAMPLE_POSITION);
		} else if(s->note == 0 && ch->sample != NULL) {
			/* Ghost instrument, trigger note */
			/* Sample position is kept, but envelopes are reset */
			xm_trigger_note(ctx, ch, XM_TRIGGER_KEEP_SAMPLE_POSITION);
		} else if(s->instrument > ctx->module.num_instruments) {
			/* Invalid instrument, Cut current note */
			xm_cut_note(ch);
			ch->instrument = NULL;
			ch->sample = NULL;
		} else {
			ch->instrument = ctx->module.instruments + (s->instrument - 1);
		}
	}

	if(NOTE_IS_VALID(s->note)) {
		/* Yes, the real note number is s->note -1. Try finding
		 * THAT in any of the specs! :-) */

		xm_instrument_t* instr = ch->instrument;

		if(HAS_TONE_PORTAMENTO(ch->current) && instr != NULL && ch->sample != NULL) {
			/* Tone portamento in effect */
			ch->note = s->note + ch->sample->relative_note + ch->sample->finetune / 128.f - 1.f;
			ch->tone_portamento_target_period = xm_period(ctx, ch->note);
		} else if(instr == NULL || ch->instrument->num_samples == 0) {
			/* Bad instrument */
			xm_cut_note(ch);
		} else {
			if(instr->sample_of_notes[s->note - 1] < instr->num_samples) {
#if XM_RAMPING
				for(unsigned int z = 0; z < XM_SAMPLE_RAMPING_POINTS; ++z) {
					ch->end_of_previous_sample[z] = xm_next_of_sample(ch);
				}
				ch->frame_count = 0;
#endif
				ch->sample = instr->samples + instr->sample_of_notes[s->note - 1];
				ch->orig_note = ch->note = s->note + ch->sample->relative_note
					+ ch->sample->finetune / 128.f - 1.f;
				if(s->instrument > 0) {
					xm_trigger_note(ctx, ch, 0);
				} else {
					/* Ghost note: keep old volume */
					xm_trigger_note(ctx, ch, XM_TRIGGER_KEEP_VOLUME);
				}
			} else {
				/* Bad sample */
				xm_cut_note(ch);
			}
		}
	} else if(s->note == 97) {
		/* Key Off */
		xm_key_off(ch);
	}

	switch(s->volume_column >> 4) {

	case 0x5:
		if(s->volume_column > 0x50) break;
	case 0x1:
	case 0x2:
	case 0x3:
	case 0x4:
		/* Set volume */
		ch->volume = (float)(s->volume_column - 0x10) / (float)0x40;
		break;

	case 0x8: /* Fine volume slide down */
		xm_volume_slide(ch, s->volume_column & 0x0F);
		break;

	case 0x9: /* Fine volume slide up */
		xm_volume_slide(ch, s->volume_column << 4);
		break;

	case 0xA: /* Set vibrato speed */
		ch->vibrato_param = (ch->vibrato_param & 0x0F) | ((s->volume_column & 0x0F) << 4);
		break;

	case 0xC: /* Set panning */
		ch->panning = (float)(
			((s->volume_column & 0x0F) << 4) | (s->volume_column & 0x0F)
			) / (float)0xFF;
		break;

	case 0xF: /* Tone portamento */
		if(s->volume_column & 0x0F) {
			ch->tone_portamento_param = ((s->volume_column & 0x0F) << 4)
				| (s->volume_column & 0x0F);
		}
		break;

	default:
		break;

	}

	switch(s->effect_type) {

	case 1: /* 1xx: Portamento up */
		if(s->effect_param > 0) {
			ch->portamento_up_param = s->effect_param;
		}
		break;

	case 2: /* 2xx: Portamento down */
		if(s->effect_param > 0) {
			ch->portamento_down_param = s->effect_param;
		}
		break;

	case 3: /* 3xx: Tone portamento */
		if(s->effect_param > 0) {
			ch->tone_portamento_param = s->effect_param;
		}
		break;

	case 4: /* 4xy: Vibrato */
		if(s->effect_param & 0x0F) {
			/* Set vibrato depth */
			ch->vibrato_param = (ch->vibrato_param & 0xF0) | (s->effect_param & 0x0F);
		}
		if(s->effect_param >> 4) {
			/* Set vibrato speed */
			ch->vibrato_param = (s->effect_param & 0xF0) | (ch->vibrato_param & 0x0F);
		}
		break;

	case 5: /* 5xy: Tone portamento + Volume slide */
		if(s->effect_param > 0) {
			ch->volume_slide_param = s->effect_param;
		}
		break;

	case 6: /* 6xy: Vibrato + Volume slide */
		if(s->effect_param > 0) {
			ch->volume_slide_param = s->effect_param;
		}
		break;

	case 7: /* 7xy: Tremolo */
		if(s->effect_param & 0x0F) {
			/* Set tremolo depth */
			ch->tremolo_param = (ch->tremolo_param & 0xF0) | (s->effect_param & 0x0F);
		}
		if(s->effect_param >> 4) {
			/* Set tremolo speed */
			ch->tremolo_param = (s->effect_param & 0xF0) | (ch->tremolo_param & 0x0F);
		}
		break;

	case 8: /* 8xx: Set panning */
		ch->panning = (float)s->effect_param / (float)0xFF;
		break;

	case 9: /* 9xx: Sample offset */
		if(ch->sample != NULL && NOTE_IS_VALID(s->note)) {
			uint32_t final_offset = s->effect_param << (ch->sample->bits == 16 ? 7 : 8);
			if(final_offset >= ch->sample->length) {
				/* Pretend the sample dosen't loop and is done playing */
				ch->sample_position = -1;
				break;
			}
			ch->sample_position = final_offset;
		}
		break;

	case 0xA: /* Axy: Volume slide */
		if(s->effect_param > 0) {
			ch->volume_slide_param = s->effect_param;
		}
		break;

	case 0xB: /* Bxx: Position jump */
		if(s->effect_param < ctx->module.length) {
			ctx->position_jump = true;
			ctx->jump_dest = s->effect_param;
			ctx->jump_row = 0;
		}
		break;

	case 0xC: /* Cxx: Set volume */
		ch->volume = (float)((s->effect_param > 0x40)
							 ? 0x40 : s->effect_param) / (float)0x40;
		break;

	case 0xD: /* Dxx: Pattern break */
		/* Jump after playing this line */
		ctx->pattern_break = true;
		ctx->jump_row = (s->effect_param >> 4) * 10 + (s->effect_param & 0x0F);
		break;

	case 0xE: /* EXy: Extended command */
		switch(s->effect_param >> 4) {

		case 1: /* E1y: Fine portamento up */
			if(s->effect_param & 0x0F) {
				ch->fine_portamento_up_param = s->effect_param & 0x0F;
			}
			xm_pitch_slide(ctx, ch, -ch->fine_portamento_up_param);
			break;

		case 2: /* E2y: Fine portamento down */
			if(s->effect_param & 0x0F) {
				ch->fine_portamento_down_param = s->effect_param & 0x0F;
			}
			xm_pitch_slide(ctx, ch, ch->fine_portamento_down_param);
			break;

		case 4: /* E4y: Set vibrato control */
			ch->vibrato_waveform = s->effect_param & 3;
			ch->vibrato_waveform_retrigger = !((s->effect_param >> 2) & 1);
			break;

		case 5: /* E5y: Set finetune */
			if(NOTE_IS_VALID(ch->current->note) && ch->sample != NULL) {
				ch->note = ch->current->note + ch->sample->relative_note +
					(float)(((s->effect_param & 0x0F) - 8) << 4) / 128.f - 1.f;
				ch->period = xm_period(ctx, ch->note);
				xm_update_frequency(ctx, ch);
			}
			break;

		case 6: /* E6y: Pattern loop */
			if(s->effect_param & 0x0F) {
				if((s->effect_param & 0x0F) == ch->pattern_loop_count) {
					/* Loop is over */
					ch->pattern_loop_count = 0;
					break;
				}

				/* Jump to the beginning of the loop */
				ch->pattern_loop_count++;
				ctx->position_jump = true;
				ctx->jump_row = ch->pattern_loop_origin;
				ctx->jump_dest = ctx->current_table_index;
			} else {
				/* Set loop start point */
				ch->pattern_loop_origin = ctx->current_row;
				/* Replicate FT2 E60 bug */
				ctx->jump_row = ch->pattern_loop_origin;
			}
			break;

		case 7: /* E7y: Set tremolo control */
			ch->tremolo_waveform = s->effect_param & 3;
			ch->tremolo_waveform_retrigger = !((s->effect_param >> 2) & 1);
			break;

		case 0xA: /* EAy: Fine volume slide up */
			if(s->effect_param & 0x0F) {
				ch->fine_volume_slide_param = s->effect_param & 0x0F;
			}
			xm_volume_slide(ch, ch->fine_volume_slide_param << 4);
			break;

		case 0xB: /* EBy: Fine volume slide down */
			if(s->effect_param & 0x0F) {
				ch->fine_volume_slide_param = s->effect_param & 0x0F;
			}
			xm_volume_slide(ch, ch->fine_volume_slide_param);
			break;

		case 0xD: /* EDy: Note delay */
			/* XXX: figure this out better. EDx triggers
			 * the note even when there no note and no
			 * instrument. But ED0 acts like like a ghost
			 * note, EDx (x ≠ 0) does not. */
			if(s->note == 0 && s->instrument == 0) {
				unsigned int flags = XM_TRIGGER_KEEP_VOLUME;

				if(ch->current->effect_param & 0x0F) {
					ch->note = ch->orig_note;
					xm_trigger_note(ctx, ch, flags);
				} else {
					xm_trigger_note(
						ctx, ch,
						flags
						| XM_TRIGGER_KEEP_PERIOD
						| XM_TRIGGER_KEEP_SAMPLE_POSITION
						);
				}
			}
			break;

		case 0xE: /* EEy: Pattern delay */
			ctx->extra_ticks = (ch->current->effect_param & 0x0F) * ctx->tempo;
			break;

		default:
			break;

		}
		break;

	case 0xF: /* Fxx: Set tempo/BPM */
		if(s->effect_param > 0) {
			if(s->effect_param <= 0x1F) {
				ctx->tempo = s->effect_param;
			} else {
				ctx->bpm = s->effect_param;
			}
		}
		break;

	case 16: /* Gxx: Set global volume */
		ctx->global_volume = (float)((s->effect_param > 0x40)
									 ? 0x40 : s->effect_param) / (float)0x40;
		break;

	case 17: /* Hxy: Global volume slide */
		if(s->effect_param > 0) {
			ch->global_volume_slide_param = s->effect_param;
		}
		break;

	case 21: /* Lxx: Set envelope position */
		ch->volume_envelope_frame_count = s->effect_param;
		ch->panning_envelope_frame_count = s->effect_param;
		break;

	case 25: /* Pxy: Panning slide */
		if(s->effect_param > 0) {
			ch->panning_slide_param = s->effect_param;
		}
		break;

	case 27: /* Rxy: Multi retrig note */
		if(s->effect_param > 0) {
			if((s->effect_param >> 4) == 0) {
				/* Keep previous x value */
				ch->multi_retrig_param = (ch->multi_retrig_param & 0xF0) | (s->effect_param & 0x0F);
			} else {
				ch->multi_retrig_param = s->effect_param;
			}
		}
		break;

	case 29: /* Txy: Tremor */
		if(s->effect_param > 0) {
			/* Tremor x and y params do not appear to be separately
			 * kept in memory, unlike Rxy */
			ch->tremor_param = s->effect_param;
		}
		break;

	case 33: /* Xxy: Extra stuff */
		switch(s->effect_param >> 4) {

		case 1: /* X1y: Extra fine portamento up */
			if(s->effect_param & 0x0F) {
				ch->extra_fine_portamento_up_param = s->effect_param & 0x0F;
			}
			xm_pitch_slide(ctx, ch, -1.0f * ch->extra_fine_portamento_up_param);
			break;

		case 2: /* X2y: Extra fine portamento down */
			if(s->effect_param & 0x0F) {
				ch->extra_fine_portamento_down_param = s->effect_param & 0x0F;
			}
			xm_pitch_slide(ctx, ch, ch->extra_fine_portamento_down_param);
			break;

		default:
			break;

		}
		break;

	default:
		break;

	}
}